

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  SourceRange range;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  string_view name;
  string_view name_00;
  bool bVar1;
  SyntaxNode *pSVar2;
  SimplePragmaExpressionSyntax *pSVar3;
  PragmaExpressionSyntax *pPVar4;
  SourceLocation in_RDI;
  string_view sVar5;
  iterator iVar6;
  SourceRange SVar7;
  PragmaExpressionSyntax *value;
  iterator __end6;
  iterator __begin6;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range6;
  ParenPragmaExpressionSyntax *paren;
  anon_class_16_2_8b023938 setDirective;
  string_view text;
  DiagnosticSeverity severity;
  NameValuePragmaExpressionSyntax *nvp;
  string_view action;
  SimplePragmaExpressionSyntax *simple;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  Token last;
  SourceLocation in_stack_fffffffffffffda8;
  SourceLocation in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdc0;
  DiagCode in_stack_fffffffffffffdc4;
  SourceLocation in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  DiagCode in_stack_fffffffffffffdd4;
  PragmaExpressionSyntax *in_stack_fffffffffffffdd8;
  ParentList *in_stack_fffffffffffffde0;
  Diagnostic *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  SyntaxNode *in_stack_fffffffffffffe00;
  ParenPragmaExpressionSyntax *in_stack_fffffffffffffe08;
  SourceLocation this_00;
  char *in_stack_fffffffffffffeb0;
  SourceManager *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  SourceLocation in_stack_fffffffffffffed0;
  string_view local_48;
  SourceLocation local_38;
  SourceLocation local_30;
  undefined4 local_24;
  Token local_20 [2];
  
  bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                    ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x37ecc5);
  if (bVar1) {
    local_20[0] = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_fffffffffffffde0);
    local_24 = 0x1d0004;
    local_38 = Token::location(local_20);
    local_48 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                             );
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_48);
    local_30 = SourceLocation::operator+<unsigned_long>
                         ((SourceLocation *)in_RDI,(unsigned_long)in_stack_fffffffffffffdb0);
    addDiag((Preprocessor *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdc4,in_RDI);
  }
  else {
    slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
              ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x37ed8e);
    slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
              ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x37edab);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                             ((self_type *)in_stack_fffffffffffffdb0,
                              (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                              in_stack_fffffffffffffda8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pSVar2 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                             *)0x37ede8)->super_SyntaxNode;
      if (pSVar2->kind == SimplePragmaExpression) {
        pSVar3 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>(pSVar2);
        Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        if ((pSVar3->value).kind == Identifier) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),(char *)in_RDI);
          __x._M_str = (char *)in_stack_fffffffffffffde0;
          __x._M_len = (size_t)in_stack_fffffffffffffdd8;
          __y._M_str._0_4_ = in_stack_fffffffffffffdd0;
          __y._M_len = (size_t)in_stack_fffffffffffffdc8;
          __y._M_str._4_4_ = in_stack_fffffffffffffdd4;
          bVar1 = std::operator==(__x,__y);
          if (bVar1) {
            in_stack_fffffffffffffdb0 = *(SourceLocation *)in_RDI;
            Token::location(&pSVar3->value);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),(char *)in_RDI)
            ;
            name._M_str._0_4_ = in_stack_fffffffffffffec8;
            name._M_len = (size_t)in_stack_fffffffffffffec0;
            name._M_str._4_4_ = in_stack_fffffffffffffecc;
            SourceManager::addDiagnosticDirective
                      (in_stack_fffffffffffffeb8,in_stack_fffffffffffffed0,name,
                       (DiagnosticSeverity)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
            goto LAB_0037f3f1;
          }
        }
        if ((pSVar3->value).kind == Identifier) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),(char *)in_RDI);
          __x_00._M_str = (char *)in_stack_fffffffffffffde0;
          __x_00._M_len = (size_t)in_stack_fffffffffffffdd8;
          __y_00._M_str._0_4_ = in_stack_fffffffffffffdd0;
          __y_00._M_len = (size_t)in_stack_fffffffffffffdc8;
          __y_00._M_str._4_4_ = in_stack_fffffffffffffdd4;
          bVar1 = std::operator==(__x_00,__y_00);
          if (bVar1) {
            in_stack_fffffffffffffda8 = *(SourceLocation *)in_RDI;
            Token::location(&pSVar3->value);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),(char *)in_RDI)
            ;
            name_00._M_str._0_4_ = in_stack_fffffffffffffec8;
            name_00._M_len = (size_t)in_stack_fffffffffffffec0;
            name_00._M_str._4_4_ = in_stack_fffffffffffffecc;
            SourceManager::addDiagnosticDirective
                      (in_stack_fffffffffffffeb8,in_stack_fffffffffffffed0,name_00,
                       (DiagnosticSeverity)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
            goto LAB_0037f3f1;
          }
        }
        Token::range((Token *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        range.startLoc._4_2_ = in_stack_fffffffffffffdc4.subsystem;
        range.startLoc._6_2_ = in_stack_fffffffffffffdc4.code;
        range.startLoc._0_4_ = in_stack_fffffffffffffdc0;
        range.endLoc = in_stack_fffffffffffffdc8;
        addDiag((Preprocessor *)in_RDI,in_stack_fffffffffffffdd4,range);
        sVar5._M_str = (char *)in_stack_fffffffffffffe00;
        sVar5._M_len = in_stack_fffffffffffffdf8;
        Diagnostic::operator<<(in_stack_fffffffffffffdf0,sVar5);
      }
      else if (pSVar2->kind == NameValuePragmaExpression) {
        in_stack_fffffffffffffed0 =
             (SourceLocation)
             slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>(pSVar2);
        sVar5 = Token::valueText((Token *)CONCAT44(in_stack_fffffffffffffdc4,
                                                   in_stack_fffffffffffffdc0));
        in_stack_fffffffffffffeb8 = (SourceManager *)sVar5._M_len;
        in_stack_fffffffffffffeb0 = sVar5._M_str;
        in_stack_fffffffffffffec0 = in_stack_fffffffffffffeb0;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),(char *)in_RDI);
        __x_01._M_str = (char *)in_stack_fffffffffffffde0;
        __x_01._M_len = (size_t)in_stack_fffffffffffffdd8;
        __y_01._M_str._0_4_ = in_stack_fffffffffffffdd0;
        __y_01._M_len = (size_t)in_stack_fffffffffffffdc8;
        __y_01._M_str._4_4_ = in_stack_fffffffffffffdd4;
        bVar1 = std::operator==(__x_01,__y_01);
        if (bVar1) {
          in_stack_fffffffffffffecc = 0;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),(char *)in_RDI);
          __x_02._M_str = (char *)in_stack_fffffffffffffde0;
          __x_02._M_len = (size_t)in_stack_fffffffffffffdd8;
          __y_02._M_str._0_4_ = in_stack_fffffffffffffdd0;
          __y_02._M_len = (size_t)in_stack_fffffffffffffdc8;
          __y_02._M_str._4_4_ = in_stack_fffffffffffffdd4;
          bVar1 = std::operator==(__x_02,__y_02);
          if (bVar1) {
            in_stack_fffffffffffffecc = 2;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),(char *)in_RDI)
            ;
            __x_03._M_str = (char *)in_stack_fffffffffffffde0;
            __x_03._M_len = (size_t)in_stack_fffffffffffffdd8;
            __y_03._M_str._0_4_ = in_stack_fffffffffffffdd0;
            __y_03._M_len = (size_t)in_stack_fffffffffffffdc8;
            __y_03._M_str._4_4_ = in_stack_fffffffffffffdd4;
            bVar1 = std::operator==(__x_03,__y_03);
            if (bVar1) {
              in_stack_fffffffffffffecc = 3;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         (char *)in_RDI);
              __x_04._M_str = (char *)in_stack_fffffffffffffde0;
              __x_04._M_len = (size_t)in_stack_fffffffffffffdd8;
              __y_04._M_str._0_4_ = in_stack_fffffffffffffdd0;
              __y_04._M_len = (size_t)in_stack_fffffffffffffdc8;
              __y_04._M_str._4_4_ = in_stack_fffffffffffffdd4;
              bVar1 = std::operator==(__x_04,__y_04);
              if (!bVar1) {
                Token::range((Token *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
                ;
                SVar7.startLoc._4_2_ = in_stack_fffffffffffffdc4.subsystem;
                SVar7.startLoc._6_2_ = in_stack_fffffffffffffdc4.code;
                SVar7.startLoc._0_4_ = in_stack_fffffffffffffdc0;
                SVar7.endLoc = in_stack_fffffffffffffdc8;
                addDiag((Preprocessor *)in_RDI,in_stack_fffffffffffffdd4,SVar7);
                goto LAB_0037f3f1;
              }
              in_stack_fffffffffffffecc = 4;
            }
          }
        }
        this_00 = in_RDI;
        pPVar4 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                           ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x37f2f1);
        if ((pPVar4->super_SyntaxNode).kind == ParenPragmaExpression) {
          pSVar2 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                              ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x37f30e)->
                    super_SyntaxNode;
          in_stack_fffffffffffffe08 =
               slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>(pSVar2);
          in_stack_fffffffffffffe00 = (SyntaxNode *)&in_stack_fffffffffffffe08->values;
          iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                            ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x37f333)
          ;
          in_stack_fffffffffffffdf0 = (Diagnostic *)iVar6.list;
          in_stack_fffffffffffffdf8 = iVar6.index;
          iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                            ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)
                             in_stack_fffffffffffffdb0);
          in_stack_fffffffffffffde0 = iVar6.list;
          while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>_>
                                   ((self_type *)in_stack_fffffffffffffdb0,
                                    (iterator_base<slang::syntax::PragmaExpressionSyntax_*> *)
                                    in_stack_fffffffffffffda8), ((bVar1 ^ 0xffU) & 1) != 0) {
            in_stack_fffffffffffffdd8 =
                 iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
                              *)0x37f372);
            applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                      ((anon_class_16_2_8b023938 *)this_00,
                       &in_stack_fffffffffffffe08->super_PragmaExpressionSyntax);
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
            ::
            operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>_>
                      ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<slang::syntax::PragmaExpressionSyntax_*>,_false>
                        *)in_stack_fffffffffffffdb0);
          }
        }
        else {
          not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
                    ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x37f3a5);
          applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                    ((anon_class_16_2_8b023938 *)this_00,
                     &in_stack_fffffffffffffe08->super_PragmaExpressionSyntax);
        }
      }
      else {
        in_stack_fffffffffffffdd4.subsystem = Preprocessor;
        in_stack_fffffffffffffdd4.code = 0x1d;
        SVar7 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe00);
        in_stack_fffffffffffffdc0 = SVar7.startLoc._0_4_;
        in_stack_fffffffffffffdc4 = SVar7.startLoc._4_4_;
        in_stack_fffffffffffffdc8 = SVar7.endLoc;
        addDiag((Preprocessor *)in_RDI,in_stack_fffffffffffffdd4,SVar7);
      }
LAB_0037f3f1:
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                  *)in_stack_fffffffffffffdb0);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            std::string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            std::string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}